

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGccDepfileLexerHelper.cxx
# Opt level: O1

void __thiscall cmGccDepfileLexerHelper::newEntry(cmGccDepfileLexerHelper *this)

{
  pointer *ppcVar1;
  iterator __position;
  pointer pcVar2;
  pointer pbVar3;
  
  if ((this->HelperState == Rule) &&
     (pcVar2 = (this->Content).
               super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
               _M_impl.super__Vector_impl_data._M_finish,
     (this->Content).super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
     ._M_impl.super__Vector_impl_data._M_start != pcVar2)) {
    pbVar3 = pcVar2[-1].rules.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((pcVar2[-1].rules.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start != pbVar3) && (pbVar3[-1]._M_string_length != 0))
    {
      this->HelperState = Failed;
    }
  }
  else {
    this->HelperState = Rule;
    __position._M_current =
         (this->Content).
         super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->Content).
        super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::_M_realloc_insert<>
                (&this->Content,__position);
    }
    else {
      ((__position._M_current)->paths).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ((__position._M_current)->paths).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ((__position._M_current)->rules).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ((__position._M_current)->paths).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ((__position._M_current)->rules).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ((__position._M_current)->rules).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ppcVar1 = &(this->Content).
                 super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
    pcVar2 = (this->Content).
             super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>._M_impl
             .super__Vector_impl_data._M_finish;
    pbVar3 = pcVar2[-1].rules.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((pcVar2[-1].rules.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start == pbVar3) || (pbVar3[-1]._M_string_length != 0))
    {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>(&pcVar2[-1].rules);
      return;
    }
  }
  return;
}

Assistant:

void cmGccDepfileLexerHelper::newEntry()
{
  if (this->HelperState == State::Rule && !this->Content.empty()) {
    if (!this->Content.back().rules.empty() &&
        !this->Content.back().rules.back().empty()) {
      this->HelperState = State::Failed;
    }
    return;
  }
  this->HelperState = State::Rule;
  this->Content.emplace_back();
  this->newRule();
}